

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# h264_residual.c
# Opt level: O0

int h264_residual_block(bitstream *str,h264_cabac_context *cabac,h264_slice *slice,
                       h264_macroblock *mb,int32_t *block,int *num,int cat,int idx,int start,int end
                       ,int maxnumcoeff,int coded)

{
  int local_54;
  int i;
  int *num_local;
  int32_t *block_local;
  h264_macroblock *mb_local;
  h264_slice *slice_local;
  h264_cabac_context *cabac_local;
  bitstream *str_local;
  
  if (cabac == (h264_cabac_context *)0x0) {
    if (coded == 0) {
      for (local_54 = 0; local_54 < maxnumcoeff; local_54 = local_54 + 1) {
        if (str->dir == VS_ENCODE) {
          if (block[local_54] != 0) {
            fprintf(_stderr,"Non-zero coordinate in a skipped block!\n");
            return 1;
          }
        }
        else {
          block[local_54] = 0;
        }
      }
      if (num != (int *)0x0) {
        *num = 0;
      }
      str_local._4_4_ = 0;
    }
    else {
      str_local._4_4_ = h264_residual_cavlc(str,slice,block,num,cat,idx,start,end,maxnumcoeff);
    }
  }
  else {
    str_local._4_4_ =
         h264_residual_cabac(str,cabac,slice,mb,block,cat,idx,start,end,maxnumcoeff,coded);
  }
  return str_local._4_4_;
}

Assistant:

int h264_residual_block(struct bitstream *str, struct h264_cabac_context *cabac, struct h264_slice *slice, struct h264_macroblock *mb, int32_t *block, int *num, int cat, int idx, int start, int end, int maxnumcoeff, int coded) {
	if (!cabac) {
		if (!coded) {
			int i;
			for (i = 0; i < maxnumcoeff; i++) {
				if (str->dir == VS_ENCODE) {
					if (block[i]) {
						fprintf(stderr, "Non-zero coordinate in a skipped block!\n");
						return 1;
					}
				} else {
					block[i] = 0;
				}
			}
			if (num)
				*num = 0;
			return 0;
		} else {
			return h264_residual_cavlc(str, slice, block, num, cat, idx, start, end, maxnumcoeff);
		}
	} else {
		return h264_residual_cabac(str, cabac, slice, mb, block, cat, idx, start, end, maxnumcoeff, coded);
	}
}